

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

PortConnectionSyntax * __thiscall slang::parsing::Parser::parsePortConnection(Parser *this)

{
  bool bVar1;
  EmptyPortConnectionSyntax *pEVar2;
  WildcardPortConnectionSyntax *pWVar3;
  OrderedPortConnectionSyntax *pOVar4;
  PropertyExprSyntax *pPVar5;
  NamedPortConnectionSyntax *pNVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  AttrList AVar8;
  Token TVar9;
  Token TVar10;
  Token local_88;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  AVar8 = parseAttributes(this);
  _Var7 = AVar8._M_extent._M_extent_value;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  local_68.super_SyntaxListBase.childCount = _Var7._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar8;
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis), bVar1)) {
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
    TVar9 = ParserBase::placeholderToken(&this->super_ParserBase);
    pEVar2 = slang::syntax::SyntaxFactory::emptyPortConnection(&this->factory,&local_68,TVar9);
    return &pEVar2->super_PortConnectionSyntax;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (!bVar1) {
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
    pPVar5 = parsePropertyExpr(this,0);
    pOVar4 = slang::syntax::SyntaxFactory::orderedPortConnection(&this->factory,&local_68,pPVar5);
    return &pOVar4->super_PortConnectionSyntax;
  }
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
  if (bVar1) {
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
    TVar10 = ParserBase::consume(&this->super_ParserBase);
    pWVar3 = slang::syntax::SyntaxFactory::wildcardPortConnection
                       (&this->factory,&local_68,TVar9,TVar10);
    return &pWVar3->super_PortConnectionSyntax;
  }
  TVar10 = ParserBase::expect(&this->super_ParserBase,Identifier);
  Token::Token(&local_78);
  Token::Token(&local_88);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    local_78 = ParserBase::consume(&this->super_ParserBase);
    bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
    if (bVar1) {
      pPVar5 = (PropertyExprSyntax *)0x0;
    }
    else {
      pPVar5 = parsePropertyExpr(this,0);
    }
    local_88 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    pPVar5 = (PropertyExprSyntax *)0x0;
  }
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
  pNVar6 = slang::syntax::SyntaxFactory::namedPortConnection
                     (&this->factory,&local_68,TVar9,TVar10,local_78,pPVar5,local_88);
  return &pNVar6->super_PortConnectionSyntax;
}

Assistant:

PortConnectionSyntax& Parser::parsePortConnection() {
    auto attributes = parseAttributes();

    // Allow for empty port connections.
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyPortConnection(attributes, placeholderToken());

    if (peek(TokenKind::Dot)) {
        auto dot = consume();

        if (peek(TokenKind::Star))
            return factory.wildcardPortConnection(attributes, dot, consume());

        auto name = expect(TokenKind::Identifier);

        PropertyExprSyntax* expr = nullptr;
        Token openParen, closeParen;

        if (peek(TokenKind::OpenParenthesis)) {
            openParen = consume();
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parsePropertyExpr(0);

            closeParen = expect(TokenKind::CloseParenthesis);
        }
        return factory.namedPortConnection(attributes, dot, name, openParen, expr, closeParen);
    }
    return factory.orderedPortConnection(attributes, parsePropertyExpr(0));
}